

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O1

bool __thiscall QDir::removeRecursively(QDir *this)

{
  QDirPrivate *pQVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  Permissions PVar5;
  byte bVar6;
  long in_FS_OFFSET;
  const_iterator __begin1;
  QDir local_88;
  QString local_80;
  DirEntry local_68;
  QDirListing local_60;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d_ptr).d.ptr;
  if ((pQVar1 != (QDirPrivate *)0x0) &&
     ((__atomic_base<int>)
      *(__int_type_conflict *)
       &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value != (__atomic_base<int>)0x1)) {
    QSharedDataPointer<QDirPrivate>::detach_helper(&this->d_ptr);
  }
  bVar2 = QDirPrivate::exists((this->d_ptr).d.ptr);
  bVar6 = 1;
  if (bVar2) {
    local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QFileSystemEntry::filePath(&local_58,&((this->d_ptr).d.ptr)->dirEntry);
    QDirListing::QDirListing(&local_60,&local_58,(IteratorFlags)0x40);
    local_68.dirListPtr = (QDirListingPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_68.dirListPtr = (QDirListingPrivate *)QDirListing::begin(&local_60);
    bVar6 = 1;
    for (; local_68.dirListPtr != (QDirListingPrivate *)0x0; local_68 = QDirListing::next(local_68))
    {
      QDirListing::DirEntry::filePath(&local_80,&local_68);
      bVar2 = QDirListing::DirEntry::isDir(&local_68);
      if (bVar2) {
        bVar2 = QDirListing::DirEntry::isSymLink(&local_68);
        if (bVar2) goto LAB_00228408;
        QDir(&local_88,&local_80);
        cVar3 = removeRecursively(&local_88);
        ~QDir(&local_88);
      }
      else {
LAB_00228408:
        iVar4 = QFile::remove((char *)&local_80);
        cVar3 = (char)iVar4;
        if (cVar3 == '\0') {
          PVar5 = QFile::permissions(&local_80);
          if (((uint)PVar5.super_QFlagsStorageHelper<QFileDevice::Permission,_4>.
                     super_QFlagsStorage<QFileDevice::Permission>.i >> 9 & 1) == 0) {
            bVar2 = QFile::setPermissions
                              (&local_80,
                               (Permissions)
                               ((uint)PVar5.super_QFlagsStorageHelper<QFileDevice::Permission,_4>.
                                      super_QFlagsStorage<QFileDevice::Permission>.i | 0x200));
            if (bVar2) {
              iVar4 = QFile::remove((char *)&local_80);
              cVar3 = (char)iVar4;
            }
            else {
              cVar3 = '\0';
            }
          }
        }
      }
      if (cVar3 == '\0') {
        bVar6 = 0;
      }
      if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    QDirListing::~QDirListing(&local_60);
    if (bVar6 != 0) {
      absolutePath(&local_80,this);
      iVar4 = rmdir(this,(char *)&local_80);
      bVar6 = (byte)iVar4;
      if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)(bVar6 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool QDir::removeRecursively()
{
    if (!d_ptr->exists())
        return true;

    bool success = true;
    const QString dirPath = path();
    // not empty -- we must empty it first
    for (const auto &dirEntry : QDirListing(dirPath, QDirListing::IteratorFlag::IncludeHidden)) {
        const QString &filePath = dirEntry.filePath();
        bool ok;
        if (dirEntry.isDir() && !dirEntry.isSymLink()) {
            ok = QDir(filePath).removeRecursively(); // recursive
        } else {
            ok = QFile::remove(filePath);
            if (!ok) { // Read-only files prevent directory deletion on Windows, retry with Write permission.
                const QFile::Permissions permissions = QFile::permissions(filePath);
                if (!(permissions & QFile::WriteUser))
                    ok = QFile::setPermissions(filePath, permissions | QFile::WriteUser)
                        && QFile::remove(filePath);
            }
        }
        if (!ok)
            success = false;
    }

    if (success)
        success = rmdir(absolutePath());

    return success;
}